

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

void char_mods_callback(GLFWwindow *window,uint codepoint,wchar_t mods)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  int iVar6;
  double dVar7;
  
  pvVar4 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar4 + 8);
  dVar7 = glfwGetTime();
  iVar3 = wctomb((char *)&get_character_string_result,codepoint);
  iVar6 = 0;
  if (iVar3 != -1) {
    iVar6 = iVar3;
  }
  *(undefined1 *)((long)&get_character_string_result + (long)iVar6) = 0;
  pcVar5 = get_mods_name(mods);
  printf("%08x to %i at %0.3f: Character 0x%08x (%s) with modifiers (with%s) input\n",dVar7,
         (ulong)uVar2,(ulong)uVar1,codepoint,&get_character_string_result,pcVar5);
  return;
}

Assistant:

static void char_mods_callback(GLFWwindow* window, unsigned int codepoint, int mods)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    printf("%08x to %i at %0.3f: Character 0x%08x (%s) with modifiers (with%s) input\n",
            counter++, slot->number, glfwGetTime(), codepoint,
            get_character_string(codepoint),
            get_mods_name(mods));
}